

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ClassType::computeSize(ClassType *this)

{
  Scope *this_00;
  Type *this_01;
  uint64_t uVar1;
  bool bVar2;
  unsigned_long uVar3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar4;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> local_70;
  ASTContext local_68;
  
  this_00 = &this->super_Scope;
  Scope::ensureElaborated(this_00);
  if ((this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
  }
  (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 0;
  if (this->isInterface == false) {
    local_68.lookupIndex = this->headerIndex;
    local_68.flags.m_bits = 0;
    local_68.instanceOrProc = (Symbol *)0x0;
    local_68.firstTempVar = (TempVarSymbol *)0x0;
    local_68.randomizeDetails = (RandomizeDetails *)0x0;
    local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_68.scope.ptr = this_00;
    sVar4 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(this_00);
    local_70 = sVar4._M_begin.current;
    uVar3 = 0;
    bVar2 = false;
    while (local_70.current != sVar4._M_end.current.current) {
      this_01 = DeclaredType::getType((DeclaredType *)(local_70.current + 1));
      uVar1 = Type::getBitstreamWidth(this_01);
      uVar3 = uVar3 + uVar1;
      if (0x3fffffff8 < uVar3) {
        ASTContext::addDiag(&local_68,(DiagCode)0x180009,(this->super_Type).super_Symbol.location);
        return;
      }
      bVar2 = (bool)(bVar2 | uVar1 == 0);
      Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::increment(&local_70);
    }
    if (!bVar2) {
      (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar3;
      (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
    }
  }
  return;
}

Assistant:

void ClassType::computeSize() const {
    ensureElaborated();
    cachedBitstreamWidth = 0;
    if (isInterface)
        return;

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    // Note: no worry of class cycles here because we set cachedBitstreamWidth
    // to zero up above, which will avoid re-entering this function.
    uint64_t totalWidth = 0;
    bool hasDynamic = false;
    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        uint64_t width = prop.getType().getBitstreamWidth();
        if (width == 0)
            hasDynamic = true;

        totalWidth += width;
        if (totalWidth > MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, location);
            return;
        }
    }

    if (!hasDynamic)
        cachedBitstreamWidth = totalWidth;
}